

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O3

bool __thiscall jbcoin::STArray::isEquivalent(STArray *this,STBase *t)

{
  STObject *pSVar1;
  bool bVar2;
  STObject *this_00;
  STObject *obj;
  
  if (t->_vptr_STBase != (_func_int **)&PTR__STArray_002d2f58) {
    return false;
  }
  this_00 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  obj = (STObject *)t[1]._vptr_STBase;
  if ((long)pSVar1 - (long)this_00 == (long)t[1].fName - (long)obj) {
    if (this_00 == pSVar1) {
      bVar2 = true;
    }
    else {
      do {
        bVar2 = STObject::operator==(this_00,obj);
        if (!bVar2) {
          return bVar2;
        }
        this_00 = this_00 + 1;
        obj = obj + 1;
      } while (this_00 != pSVar1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool STArray::isEquivalent (const STBase& t) const
{
    auto v = dynamic_cast<const STArray*> (&t);
    return v != nullptr && v_ == v->v_;
}